

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

void Llb4_Nonlin4Sweep(Aig_Man_t *pAig,int nSweepMax,int nClusterMax,DdManager **pdd,
                      Vec_Int_t **pvOrder,Vec_Ptr_t **pvGroups,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  DdNode *pDVar6;
  int local_54;
  int nCutPoints;
  int Counter;
  Vec_Int_t *vOrder;
  Vec_Ptr_t *vGroups;
  DdManager *ddWork;
  DdManager *ddBad;
  Vec_Ptr_t **pvGroups_local;
  Vec_Int_t **pvOrder_local;
  DdManager **pdd_local;
  int nClusterMax_local;
  int nSweepMax_local;
  Aig_Man_t *pAig_local;
  
  ddBad = (DdManager *)pvGroups;
  pvGroups_local = (Vec_Ptr_t **)pvOrder;
  pvOrder_local = (Vec_Int_t **)pdd;
  pdd_local._0_4_ = nClusterMax;
  pdd_local._4_4_ = nSweepMax;
  _nClusterMax_local = pAig;
  Aig_ManCleanMarkA(pAig);
  _nCutPoints = (Vec_Ptr_t *)Llb_Nonlin4SweepOrder(_nClusterMax_local,&local_54,1);
  iVar4 = local_54;
  iVar3 = Aig_ManNodeNum(_nClusterMax_local);
  if (iVar4 != iVar3) {
    __assert_fail("Counter == Aig_ManNodeNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Sweep.c"
                  ,0x212,
                  "void Llb4_Nonlin4Sweep(Aig_Man_t *, int, int, DdManager **, Vec_Int_t **, Vec_Ptr_t **, int)"
                 );
  }
  iVar4 = Llb4_Nonlin4SweepCutpoints
                    (_nClusterMax_local,(Vec_Int_t *)_nCutPoints,pdd_local._4_4_,fVerbose);
  Vec_IntFree((Vec_Int_t *)_nCutPoints);
  _nCutPoints = (Vec_Ptr_t *)Llb_Nonlin4SweepOrder(_nClusterMax_local,&local_54,0);
  if (local_54 == iVar4) {
    Aig_ManCleanMarkA(_nClusterMax_local);
    pAVar2 = _nClusterMax_local;
    pVVar1 = _nCutPoints;
    iVar3 = Aig_ManCiNum(_nClusterMax_local);
    iVar5 = Aig_ManCoNum(_nClusterMax_local);
    ddWork = Llb4_Nonlin4SweepBadStates(pAVar2,(Vec_Int_t *)pVVar1,iVar4 + iVar3 + iVar5);
    pAVar2 = _nClusterMax_local;
    pVVar1 = _nCutPoints;
    iVar3 = Aig_ManCiNum(_nClusterMax_local);
    iVar5 = Aig_ManCoNum(_nClusterMax_local);
    vGroups = (Vec_Ptr_t *)
              Llb4_Nonlin4SweepGroups
                        (pAVar2,(Vec_Int_t *)pVVar1,iVar4 + iVar3 + iVar5,(Vec_Ptr_t **)&vOrder,
                         (int)pdd_local,fVerbose);
    pDVar6 = Cudd_bddTransfer(ddWork,(DdManager *)vGroups,ddWork->bFunc);
    *(DdNode **)(vGroups + 0x2e) = pDVar6;
    Cudd_Ref(*(DdNode **)(vGroups + 0x2e));
    Cudd_RecursiveDeref(ddWork,ddWork->bFunc);
    ddWork->bFunc = (DdNode *)0x0;
    Extra_StopManager(ddWork);
    Llb_Nonlin4SweepPrintSuppProfile
              ((DdManager *)vGroups,_nClusterMax_local,(Vec_Int_t *)_nCutPoints,(Vec_Ptr_t *)vOrder,
               fVerbose);
    *pvOrder_local = (Vec_Int_t *)vGroups;
    *pvGroups_local = _nCutPoints;
    *(Vec_Int_t **)&ddBad->sentinel = vOrder;
    return;
  }
  __assert_fail("Counter == nCutPoints",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb4Sweep.c"
                ,0x218,
                "void Llb4_Nonlin4Sweep(Aig_Man_t *, int, int, DdManager **, Vec_Int_t **, Vec_Ptr_t **, int)"
               );
}

Assistant:

void Llb4_Nonlin4Sweep( Aig_Man_t * pAig, int nSweepMax, int nClusterMax, DdManager ** pdd, Vec_Int_t ** pvOrder, Vec_Ptr_t ** pvGroups, int fVerbose )
{
    DdManager * ddBad, * ddWork;
    Vec_Ptr_t * vGroups;
    Vec_Int_t * vOrder;
    int Counter, nCutPoints;

    // get the original ordering
    Aig_ManCleanMarkA( pAig );
    vOrder = Llb_Nonlin4SweepOrder( pAig, &Counter, 1 );
    assert( Counter == Aig_ManNodeNum(pAig) );
    // mark the nodes
    nCutPoints = Llb4_Nonlin4SweepCutpoints( pAig, vOrder, nSweepMax, fVerbose );
    Vec_IntFree( vOrder );
    // get better ordering
    vOrder = Llb_Nonlin4SweepOrder( pAig, &Counter, 0 );
    assert( Counter == nCutPoints );
    Aig_ManCleanMarkA( pAig );
    // compute the BAD states
    ddBad = Llb4_Nonlin4SweepBadStates( pAig, vOrder, nCutPoints + Aig_ManCiNum(pAig) + Aig_ManCoNum(pAig) );
    // compute the clusters
    ddWork = Llb4_Nonlin4SweepGroups( pAig, vOrder, nCutPoints + Aig_ManCiNum(pAig) + Aig_ManCoNum(pAig), &vGroups, nClusterMax, fVerbose );
    // transfer the result from the Bad manager
//printf( "Bad before = %d.\n", Cudd_DagSize(ddBad->bFunc) );
    ddWork->bFunc = Cudd_bddTransfer( ddBad, ddWork, ddBad->bFunc );   Cudd_Ref( ddWork->bFunc );
    Cudd_RecursiveDeref( ddBad, ddBad->bFunc );  ddBad->bFunc = NULL;
    Extra_StopManager( ddBad );
    // update ordering to exclude quantified variables
//printf( "Bad after = %d.\n", Cudd_DagSize(ddWork->bFunc) );

    Llb_Nonlin4SweepPrintSuppProfile( ddWork, pAig, vOrder, vGroups, fVerbose );

    // return the result
    *pdd = ddWork;
    *pvOrder = vOrder;
    *pvGroups = vGroups;
}